

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler>::
ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler>::ProblemHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler> *this
          ,int info)

{
  Writer *pWVar1;
  uint num_values;
  Writer *pWVar2;
  IntSuffixHandler suffix_handler;
  SuffixHandler<int> local_78;
  StringRef local_68;
  ulong local_58;
  ulong local_48;
  
  num_values = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler>
               ::ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler>
                           *)this,1,2);
  local_68 = BinaryReader<mp::internal::IdentityConverter>::ReadString
                       (*(BinaryReader<mp::internal::IdentityConverter> **)this);
  local_58 = (ulong)(info & 3);
  local_48 = (ulong)num_values;
  if ((info & 4U) == 0) {
    pWVar1 = *(Writer **)(this + 0x10);
    pWVar2 = TestNLHandler::WriteSep((TestNLHandler *)pWVar1);
    fmt::BasicWriter<char>::write(pWVar2,0x26c1e4,(void *)0x22b,(size_t)&local_68);
    local_78.first_ = true;
    local_78.log_ = pWVar1;
    ReadSuffixValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler>::IntReader,TestNLHandler::SuffixHandler<int>>
              (this,num_values,1,&local_78);
    TestNLHandler::SuffixHandler<int>::~SuffixHandler(&local_78);
  }
  else {
    pWVar1 = *(Writer **)(this + 0x10);
    pWVar2 = TestNLHandler::WriteSep((TestNLHandler *)pWVar1);
    fmt::BasicWriter<char>::write(pWVar2,0x26c1e4,(void *)0x22b,(size_t)&local_68);
    local_78.first_ = true;
    local_78.log_ = pWVar1;
    ReadSuffixValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler>::DoubleReader,TestNLHandler::SuffixHandler<double>>
              (this,num_values,1,(SuffixHandler<double> *)&local_78);
    TestNLHandler::SuffixHandler<double>::~SuffixHandler((SuffixHandler<double> *)&local_78);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadSuffix(int info) {
  int num_items = ItemInfo(*this).num_items();
  int num_values = ReadUInt(1, num_items + 1);
  fmt::StringRef name = reader_.ReadName();
  reader_.ReadTillEndOfLine();
  suf::Kind kind = static_cast<suf::Kind>(info & internal::SUFFIX_KIND_MASK);
  if ((info & suf::FLOAT) != 0) {
    typename Handler::DblSuffixHandler
        suffix_handler = handler_.OnDblSuffix(name, kind, num_values);
    ReadSuffixValues<DoubleReader>(num_values, num_items, suffix_handler);
  } else {
    typename Handler::IntSuffixHandler
        suffix_handler = handler_.OnIntSuffix(name, kind, num_values);
    ReadSuffixValues<IntReader>(num_values, num_items, suffix_handler);
  }
}